

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fields.c
# Opt level: O0

void initUVP(double ***U,double ***V,double ***P,int imax,int jmax,double *init)

{
  double **ppdVar1;
  int in_ECX;
  double **in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  long in_R9;
  
  if (((in_RDI != (undefined8 *)0x0) && (in_RSI != (undefined8 *)0x0)) && (in_RDX != (double **)0x0)
     ) {
    ppdVar1 = create2Dfield((int)((ulong)in_RDX >> 0x20),(int)in_RDX);
    *in_RDX = (double *)ppdVar1;
    ppdVar1 = create2Dfield((int)((ulong)in_RDX >> 0x20),(int)in_RDX);
    *in_RDI = ppdVar1;
    ppdVar1 = create2Dfield((int)((ulong)in_RDX >> 0x20),(int)in_RDX);
    *in_RSI = ppdVar1;
    if (in_R9 != 0) {
      fill2Dfield((double)in_RSI,in_RDX,in_ECX,in_R8D);
      fill2Dfield((double)in_RSI,in_RDX,in_ECX,in_R8D);
      fill2Dfield((double)in_RSI,in_RDX,in_ECX,in_R8D);
    }
  }
  return;
}

Assistant:

void initUVP (REAL ***U, REAL ***V, REAL ***P, int imax, int jmax, REAL *init)
{
	if (!U || !V || !P)
		return;
	*P = create2Dfield(imax+2,jmax+2);
	*U = create2Dfield(imax+3,jmax+2);
	*V = create2Dfield(imax+2,jmax+3);
	if (!init)
		return;
	fill2Dfield(init[2],*P,imax+2,jmax+2);
	fill2Dfield(init[0],*U,imax+3,jmax+2);
	fill2Dfield(init[1],*V,imax+2,jmax+3);
	return;
}